

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.c
# Opt level: O1

void __thiscall Sparse_matrix_to_QMatrix(void *this,QMatrix *qmatrix)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  size_t Entry;
  ulong uVar5;
  ulong RoC;
  
  if (*this != 0) {
    uVar5 = 0;
    do {
      RoC = uVar5 + 1;
      iVar1 = *(int *)(*(long *)((long)this + 8) + 4 + uVar5 * 4);
      iVar2 = *(int *)(*(long *)((long)this + 8) + uVar5 * 4);
      Q_SetLen(qmatrix,RoC,(ulong)((iVar1 - iVar2) + 1));
      Q_SetEntry(qmatrix,RoC,0,RoC,*(Real *)(*(long *)((long)this + 0x10) + uVar5 * 8));
      uVar3 = iVar1 - iVar2;
      if (uVar3 != 0) {
        Entry = 0;
        do {
          uVar4 = (ulong)(uint)(*(int *)(*(long *)((long)this + 8) + uVar5 * 4) + (int)Entry);
          Entry = Entry + 1;
          Q_SetEntry(qmatrix,RoC,Entry,(ulong)(*(int *)(*(long *)((long)this + 8) + uVar4 * 4) + 1),
                     *(Real *)(*(long *)((long)this + 0x10) + uVar4 * 8));
        } while (uVar3 != Entry);
      }
      uVar5 = RoC;
    } while (RoC < *this);
  }
  return;
}

Assistant:

void Sparse_matrix_to_QMatrix (
    Sparse_matrix const * this,
    QMatrix * qmatrix) {

  register unsigned row, index, row_length, position;

  for (row = 0; row < this->size; ++row) {
    row_length = this->indices[row + 1] - this->indices[row];
    Q_SetLen (qmatrix, row + 1, row_length + 1);
    Q_SetEntry (qmatrix, row + 1, 0, row + 1, this->elements[row]);
    for (index = 0; index < row_length; ++index) {
      position = this->indices[row] + index;
      Q_SetEntry (qmatrix, row + 1, index + 1, this->indices[position] + 1, this->elements[position]);
    }
  }
}